

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void AR30ToABGRRow_C(uint8_t *src_ar30,uint8_t *dst_abgr,int width)

{
  uint uVar1;
  uint32_t a;
  uint32_t r;
  uint32_t g;
  uint32_t b;
  uint32_t ar30;
  int x;
  int width_local;
  uint8_t *dst_abgr_local;
  uint8_t *src_ar30_local;
  
  dst_abgr_local = dst_abgr;
  src_ar30_local = src_ar30;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *(uint *)src_ar30_local;
    *(uint *)dst_abgr_local =
         uVar1 >> 0x16 & 0xff | (uVar1 >> 0xc & 0xff) << 8 | (uVar1 >> 2 & 0xff) << 0x10 |
         (uVar1 >> 0x1e) * 0x55000000;
    dst_abgr_local = dst_abgr_local + 4;
    src_ar30_local = src_ar30_local + 4;
  }
  return;
}

Assistant:

void AR30ToABGRRow_C(const uint8_t* src_ar30, uint8_t* dst_abgr, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t ar30;
    memcpy(&ar30, src_ar30, sizeof ar30);
    uint32_t b = (ar30 >> 2) & 0xff;
    uint32_t g = (ar30 >> 12) & 0xff;
    uint32_t r = (ar30 >> 22) & 0xff;
    uint32_t a = (ar30 >> 30) * 0x55;  // Replicate 2 bits to 8 bits.
    *(uint32_t*)(dst_abgr) = r | (g << 8) | (b << 16) | (a << 24);
    dst_abgr += 4;
    src_ar30 += 4;
  }
}